

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

bool __thiscall RealDiskInterface::MakeDir(RealDiskInterface *this,string *path)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  string *path_local;
  RealDiskInterface *this_local;
  
  iVar1 = anon_unknown.dwarf_1273c6::MakeDir(path);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x11) {
      this_local._7_1_ = true;
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      Error("mkdir(%s): %s",uVar3,pcVar4);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RealDiskInterface::MakeDir(const string& path) {
  if (::MakeDir(path) < 0) {
    if (errno == EEXIST) {
      return true;
    }
    Error("mkdir(%s): %s", path.c_str(), strerror(errno));
    return false;
  }
  return true;
}